

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_60e82::BuildSystemImpl::attachDB
          (BuildSystemImpl *this,StringRef filename,string *error_out)

{
  bool bVar1;
  uint32_t uVar2;
  StringRef path;
  unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> local_58;
  undefined4 local_4c;
  char *local_48;
  size_t local_40;
  unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> local_38;
  unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> db;
  string *error_out_local;
  BuildSystemImpl *this_local;
  StringRef filename_local;
  
  local_40 = filename.Length;
  local_48 = filename.Data;
  db._M_t.
  super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>._M_t.
  super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>.
  super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl =
       (__uniq_ptr_data<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>,_true,_true>
        )(__uniq_ptr_data<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>,_true,_true>
          )error_out;
  uVar2 = getMergedSchemaVersion(this);
  path.Length = (size_t)local_48;
  path.Data = (char *)&local_38;
  llbuild::core::createSQLiteBuildDB(path,(uint32_t)local_40,SUB41(uVar2,0),(string *)0x1);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
  if (bVar1) {
    std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::
    unique_ptr(&local_58,&local_38);
    filename_local.Length._7_1_ =
         llbuild::core::BuildEngine::attachDB
                   (&this->buildEngine,&local_58,
                    (string *)
                    db._M_t.
                    super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>
                    .super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl);
    std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::
    ~unique_ptr(&local_58);
  }
  else {
    filename_local.Length._7_1_ = false;
  }
  local_4c = 1;
  std::unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>::~unique_ptr
            (&local_38);
  return filename_local.Length._7_1_;
}

Assistant:

bool attachDB(StringRef filename, std::string* error_out) {
    // FIXME: How do we pass the client schema version here, if we haven't
    // loaded the file yet.
    std::unique_ptr<core::BuildDB> db(
                                      core::createSQLiteBuildDB(filename, getMergedSchemaVersion(), /* recreateUnmatchedVersion = */ true, error_out));
    if (!db)
      return false;

    return buildEngine.attachDB(std::move(db), error_out);
  }